

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall embree::Scene::createSubdivAccel(Scene *this)

{
  int iVar1;
  Accel *accel;
  undefined8 *puVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(this->super_AccelN).field_0x188 + 0x3a0));
  lVar3 = *(long *)&(this->super_AccelN).field_0x188;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)(lVar3 + 0x3a0));
    lVar3 = *(long *)&(this->super_AccelN).field_0x188;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)(lVar3 + 0x3a0));
      if (iVar1 != 0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&local_38,"unknown subdiv accel ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(this->super_AccelN).field_0x188 + 0x3a0));
        *puVar2 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar2 + 1) = 2;
        puVar2[2] = puVar2 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 2),local_38._M_dataplus._M_p,
                   local_38._M_dataplus._M_p + local_38._M_string_length);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      lVar3 = *(long *)&(this->super_AccelN).field_0x188;
    }
  }
  accel = BVH4Factory::BVH4SubdivPatch1(*(BVH4Factory **)(lVar3 + 0x560),this);
  AccelN::accels_add(&this->super_AccelN,accel);
  return;
}

Assistant:

void Scene::createSubdivAccel()
  {
#if defined(EMBREE_GEOMETRY_SUBDIVISION)
    if (device->subdiv_accel == "default") {
      accels_add(device->bvh4_factory->BVH4SubdivPatch1(this));
    }
    else if (device->subdiv_accel == "bvh4.grid.eager" ) accels_add(device->bvh4_factory->BVH4SubdivPatch1(this));
    else if (device->subdiv_accel == "bvh4.subdivpatch1eager" ) accels_add(device->bvh4_factory->BVH4SubdivPatch1(this));
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown subdiv accel "+device->subdiv_accel);
#endif
  }